

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

int __thiscall
QUnsortedModelEngine::buildIndices
          (QUnsortedModelEngine *this,QString *str,QModelIndex *parent,int n,QIndexMapper *indices,
          QMatchData *m)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  long *plVar4;
  ulong uVar5;
  int in_ECX;
  undefined8 in_RDX;
  CaseSensitivity in_ESI;
  long in_RDI;
  long in_R9;
  long in_FS_OFFSET;
  int count;
  int i;
  QAbstractItemModel *model;
  QString data;
  QModelIndex idx;
  undefined4 in_stack_ffffffffffffff08;
  ItemFlag in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  long in_stack_ffffffffffffff18;
  int index;
  QIndexMapper *in_stack_ffffffffffffff20;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 *local_58;
  undefined4 local_48;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QIndexMapper local_28;
  
  local_28._32_8_ = *(long *)(in_FS_OFFSET + 0x28);
  plVar4 = (long *)QAbstractProxyModel::sourceModel();
  local_b0 = 0;
  local_ac = 0;
  local_b4 = in_stack_ffffffffffffff14;
  while( true ) {
    iVar2 = QIndexMapper::count((QIndexMapper *)CONCAT44(local_b4,in_stack_ffffffffffffff10));
    index = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    if (iVar2 <= local_ac || local_b0 == in_ECX) break;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    iVar2 = QIndexMapper::operator[](in_stack_ffffffffffffff20,index);
    (**(code **)(*plVar4 + 0x60))
              (&local_40,plVar4,iVar2,*(undefined4 *)(*(long *)(in_RDI + 0x68) + 0xc0),in_RDX);
    local_48 = (**(code **)(*plVar4 + 0x138))(plVar4,&local_40);
    local_44.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)CONCAT44(local_b4,in_stack_ffffffffffffff10),
                    in_stack_ffffffffffffff0c);
    bVar1 = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_44);
    if (!bVar1) {
      local_68 = 0xaaaaaaaa;
      uStack_64 = 0xaaaaaaaa;
      uStack_60 = 0xaaaaaaaa;
      uStack_5c = 0xaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff20 = &local_28;
      (**(code **)(*plVar4 + 0x90))
                (in_stack_ffffffffffffff20,plVar4,&local_40,
                 *(undefined4 *)(*(long *)(in_RDI + 0x68) + 0xbc));
      ::QVariant::toString();
      ::QVariant::~QVariant((QVariant *)in_stack_ffffffffffffff20);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)(*(long *)(in_RDI + 0x68) + 0x9c));
      switch(IVar3) {
      case 0:
      case 4:
      case 5:
      case 8:
      case 0x10:
      case 0x20:
      case 0x40:
        break;
      case 1:
        bVar1 = QString::contains((QString *)CONCAT44(local_b4,in_stack_ffffffffffffff10),
                                  (QString *)
                                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                  CaseInsensitive);
        if (bVar1) break;
        local_b4 = 4;
        goto LAB_00a6c1e3;
      case 2:
        uVar5 = QString::startsWith((QString *)&local_68,in_ESI);
        if ((uVar5 & 1) == 0) {
          local_b4 = 4;
          goto LAB_00a6c1e3;
        }
        break;
      case 3:
        uVar5 = QString::endsWith((QString *)&local_68,in_ESI);
        if ((uVar5 & 1) == 0) {
          local_b4 = 4;
          goto LAB_00a6c1e3;
        }
      }
      in_stack_ffffffffffffff18 = in_R9;
      QIndexMapper::operator[](in_stack_ffffffffffffff20,(int)((ulong)in_R9 >> 0x20));
      QIndexMapper::append
                ((QIndexMapper *)CONCAT44(local_b4,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff0c);
      local_b0 = local_b0 + 1;
      if ((*(int *)(in_R9 + 0x28) == -1) &&
         (iVar2 = QString::compare((QString *)CONCAT44(local_b4,in_stack_ffffffffffffff10),
                                   (QString *)
                                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                   CaseInsensitive), iVar2 == 0)) {
        iVar2 = QIndexMapper::operator[]
                          (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20)
                          );
        *(int *)(in_R9 + 0x28) = iVar2;
        if (in_ECX != -1) goto LAB_00a6c1db;
        local_6c = QIndexMapper::operator[]
                             (in_stack_ffffffffffffff20,
                              (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        local_b4 = 1;
      }
      else {
LAB_00a6c1db:
        local_b4 = 0;
      }
LAB_00a6c1e3:
      QString::~QString((QString *)0xa6c1f0);
      if ((local_b4 != 0) && (local_b4 == 1)) goto LAB_00a6c235;
    }
    local_ac = local_ac + 1;
  }
  local_6c = QIndexMapper::operator[](in_stack_ffffffffffffff20,index);
LAB_00a6c235:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28._32_8_) {
    return local_6c;
  }
  __stack_chk_fail();
}

Assistant:

int QUnsortedModelEngine::buildIndices(const QString& str, const QModelIndex& parent, int n,
                                      const QIndexMapper& indices, QMatchData* m)
{
    Q_ASSERT(m->partial);
    Q_ASSERT(n != -1 || m->exactMatchIndex == -1);
    const QAbstractItemModel *model = c->proxy->sourceModel();
    int i, count = 0;

    for (i = 0; i < indices.count() && count != n; ++i) {
        QModelIndex idx = model->index(indices[i], c->column, parent);

        if (!(model->flags(idx) & Qt::ItemIsSelectable))
            continue;

        QString data = model->data(idx, c->role).toString();

        switch (c->filterMode) {
        case Qt::MatchStartsWith:
            if (!data.startsWith(str, c->cs))
                continue;
            break;
        case Qt::MatchContains:
            if (!data.contains(str, c->cs))
                continue;
            break;
        case Qt::MatchEndsWith:
            if (!data.endsWith(str, c->cs))
                continue;
            break;
        case Qt::MatchExactly:
        case Qt::MatchFixedString:
        case Qt::MatchCaseSensitive:
        case Qt::MatchRegularExpression:
        case Qt::MatchWildcard:
        case Qt::MatchWrap:
        case Qt::MatchRecursive:
            Q_UNREACHABLE();
            break;
        }
        m->indices.append(indices[i]);
        ++count;
        if (m->exactMatchIndex == -1 && QString::compare(data, str, c->cs) == 0) {
            m->exactMatchIndex = indices[i];
            if (n == -1)
                return indices[i];
        }
    }
    return indices[i-1];
}